

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

JavascriptArray *
Js::JavascriptOperators::GetOwnEnumerablePropertyNames
          (RecyclableObject *object,ScriptContext *scriptContext)

{
  code *pcVar1;
  uint32 itemIndex;
  bool bVar2;
  BOOL BVar3;
  JavascriptProxy *this;
  JavascriptArray *pJVar4;
  undefined4 *puVar5;
  Var pvVar6;
  Type TVar7;
  undefined1 local_98 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  JavascriptArray *local_40;
  Type local_34;
  
  bVar2 = VarIsImpl<Js::JavascriptProxy>(object);
  if (bVar2) {
    this = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(object);
    if (this != (JavascriptProxy *)0x0) {
      propertyRecord = (PropertyRecord *)0x0;
      pJVar4 = JavascriptProxy::PropertyKeysTrap(this,GetOwnPropertyNamesKind,scriptContext);
      local_40 = JavascriptLibrary::CreateArray
                           ((scriptContext->super_ScriptContextBase).javascriptLibrary,0);
      local_34 = (pJVar4->super_ArrayObject).length;
      local_50 = (PropertyRecord *)0x0;
      propertyDescriptor._40_8_ = pJVar4;
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      TVar7 = 0;
      do {
        if (local_34 == TVar7) {
          return local_40;
        }
        pvVar6 = (Var)(**(code **)(*(long *)propertyDescriptor._40_8_ + 0x390))
                                (propertyDescriptor._40_8_,TVar7);
        bVar2 = VarIs<Js::JavascriptSymbol>(pvVar6);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x506,"(!VarIs<JavascriptSymbol>(element))",
                                      "!VarIs<JavascriptSymbol>(element)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
        JavascriptConversion::ToPropertyKey(pvVar6,scriptContext,&local_50,(PropertyString **)0x0);
        BVar3 = GetOwnPropertyDescriptor
                          (object,local_50->pid,scriptContext,(PropertyDescriptor *)local_98);
        if (BVar3 != 0) {
          bVar2 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_98);
          if (bVar2) {
            itemIndex = (uint32)propertyRecord;
            pvVar6 = CrossSite::MarshalVar(scriptContext,pvVar6,false);
            JavascriptArray::DirectSetItemAt<void*>(local_40,itemIndex,pvVar6);
            propertyRecord = (PropertyRecord *)(ulong)(itemIndex + 1);
          }
        }
        TVar7 = TVar7 + 1;
      } while( true );
    }
  }
  pJVar4 = JavascriptObject::CreateOwnEnumerableStringPropertiesHelper(object,scriptContext);
  return pJVar4;
}

Assistant:

JavascriptArray* JavascriptOperators::GetOwnEnumerablePropertyNames(RecyclableObject* object, ScriptContext* scriptContext)
    {
        JavascriptProxy* proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(object);
        if (proxy)
        {
            JavascriptArray* proxyResult = proxy->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::GetOwnPropertyNamesKind, scriptContext);
            JavascriptArray* proxyResultToReturn = scriptContext->GetLibrary()->CreateArray(0);

            // filter enumerable keys
            uint32 resultLength = proxyResult->GetLength();
            Var element;
            const Js::PropertyRecord *propertyRecord = nullptr;
            uint32 index = 0;
            for (uint32 i = 0; i < resultLength; i++)
            {
                element = proxyResult->DirectGetItem(i);

                Assert(!VarIs<JavascriptSymbol>(element));

                PropertyDescriptor propertyDescriptor;
                JavascriptConversion::ToPropertyKey(element, scriptContext, &propertyRecord, nullptr);
                if (JavascriptOperators::GetOwnPropertyDescriptor(object, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
                {
                    if (propertyDescriptor.IsEnumerable())
                    {
                        proxyResultToReturn->DirectSetItemAt(index++, CrossSite::MarshalVar(scriptContext, element));
                    }
                }
            }
            return proxyResultToReturn;
        }

        return JavascriptObject::CreateOwnEnumerableStringPropertiesHelper(object, scriptContext);
    }